

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

__pid_t __thiscall kj::_::Mutex::wait(Mutex *this,void *__stat_loc)

{
  timespec tVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  __pid_t extraout_EAX;
  Own<kj::Exception,_std::nullptr_t> *this_00;
  RefOrVoid<kj::Exception> t_00;
  Exception *exception_00;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *in_RDX;
  Type *func;
  Own<kj::Exception,_std::nullptr_t> *exception;
  Own<kj::Exception,_std::nullptr_t> *_exception479;
  Fault local_190;
  Fault f_1;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_180;
  undefined1 local_169;
  undefined4 local_168;
  int local_164;
  uint expected;
  Fault f;
  undefined1 local_150 [8];
  DebugComparison<kj::Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>_&,_const_kj::None_&>
  _kjCondition;
  undefined1 auStack_120 [4];
  int error;
  timespec **local_118;
  int local_10c;
  TimePoint TStack_108;
  int _kjSyscallError;
  Quantity<long,_kj::_::NanosecondLabel> local_100;
  timespec local_f8;
  Quantity<long,_kj::_::NanosecondLabel> *local_e8;
  Quantity<long,_kj::_::NanosecondLabel> *t;
  Quantity<long,_kj::_::NanosecondLabel> *_t424;
  timespec *tsp;
  timespec ts;
  undefined1 local_a0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
  _kjDefer416;
  BlockedOnCondVarWait local_6e;
  BlockedOnReason local_6d [2];
  bool currentlyLocked;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:405:3)>
  _kjDefer405;
  BlockedOnReason blockReason;
  undefined1 local_58 [8];
  Waiter waiter;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *timeout_local;
  Predicate *predicate_local;
  Mutex *this_local;
  
  Maybe<kj::_::Mutex::Waiter_&>::Maybe((Maybe<kj::_::Mutex::Waiter_&> *)local_58);
  waiter.next.ptr = (Waiter *)this->waitersTail;
  waiter.prev = (Maybe<kj::_::Mutex::Waiter_&> *)__stat_loc;
  Maybe<kj::Own<kj::Exception,_std::nullptr_t>_>::Maybe();
  waiter.exception.ptr.ptr._0_4_ = 0;
  bVar2 = Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::operator==(in_RDX);
  waiter.exception.ptr.ptr._4_1_ = ~bVar2 & 1;
  addWaiter(this,(Waiter *)local_58);
  BlockedOnCondVarWait::BlockedOnCondVarWait(&local_6e,this,local_58);
  BlockedOnReason::BlockedOnReason(local_6d,&local_6e);
  defer<kj::_::Mutex::wait(kj::_::Mutex::Predicate&,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__0>
            ((kj *)((long)&_kjDefer416.maybeFunc.ptr.field_1 + 0x1f),
             (Type *)((long)&_kjDefer416.maybeFunc.ptr.field_1 + 0x1e));
  _kjDefer416.maybeFunc.ptr.field_1._29_1_ = 1;
  ts.tv_nsec = (long)&_kjDefer416.maybeFunc.ptr.field_1 + 0x1d;
  defer<kj::_::Mutex::wait(kj::_::Mutex::Predicate&,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__1>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
              *)local_a0,(kj *)&ts.tv_nsec,func);
  bVar3 = (*(code *)**__stat_loc)();
  if ((bVar3 & 1) == 0) {
    unlock(this,EXCLUSIVE,(Waiter *)local_58);
    _kjDefer416.maybeFunc.ptr.field_1._29_1_ = 0;
    _t424 = (Quantity<long,_kj::_::NanosecondLabel> *)0x0;
    t = readMaybe<kj::Quantity<long,kj::_::NanosecondLabel>>(in_RDX);
    tVar1.tv_nsec = ts.tv_sec;
    tVar1.tv_sec = (__time_t)tsp;
    if (t != (Quantity<long,_kj::_::NanosecondLabel> *)0x0) {
      local_e8 = t;
      TStack_108 = anon_unknown_39::now();
      local_100.value =
           (long)Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator+
                           (&stack0xfffffffffffffef8,local_e8);
      local_f8 = anon_unknown_39::toAbsoluteTimespec((TimePoint)local_100.value);
      _t424 = (Quantity<long,_kj::_::NanosecondLabel> *)&tsp;
      tVar1 = local_f8;
    }
    ts.tv_sec = tVar1.tv_nsec;
    tsp = (timespec *)tVar1.tv_sec;
    setCurrentThreadIsWaitingFor(local_6d);
    do {
      _auStack_120 = (Waiter *)local_58;
      local_118 = (timespec **)&_t424;
      local_10c = Debug::
                  syscallError<kj::_::Mutex::wait(kj::_::Mutex::Predicate&,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__2>
                            ((anon_class_16_2_8071f6fa *)auStack_120,false);
      iVar4 = local_164;
      if ((local_10c != 0) && (_kjCondition._36_4_ = local_10c, local_10c != 0xb)) {
        if (local_10c != 0x6e) {
          Debug::Fault::Fault(&local_190,
                              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                              ,0x1d1,local_10c,"futex(FUTEX_WAIT_PRIVATE)","");
          Debug::Fault::fatal(&local_190);
        }
        f.exception = (Exception *)
                      DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&_::MAGIC_ASSERT,in_RDX);
        DebugExpression<kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>&>::operator!=
                  ((DebugComparison<kj::Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>_&,_const_kj::None_&>
                    *)local_150,
                   (DebugExpression<kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>&> *)&f,
                   (None *)&none);
        bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
        if (!bVar2) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::None_const&>&>
                    ((Fault *)&stack0xfffffffffffffea0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                     ,0x1c0,FAILED,"timeout != kj::none","_kjCondition,",
                     (DebugComparison<kj::Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>_&,_const_kj::None_&>
                      *)local_150);
          Debug::Fault::fatal((Fault *)&stack0xfffffffffffffea0);
        }
        local_164 = 0;
        local_168 = 1;
        LOCK();
        local_169 = (int)waiter.exception.ptr.ptr == 0;
        iVar4 = (int)waiter.exception.ptr.ptr;
        if ((bool)local_169) {
          waiter.exception.ptr.ptr._0_4_ = 1;
          iVar4 = 0;
        }
        UNLOCK();
        if ((bool)local_169) {
          setCurrentThreadIsNoLongerWaiting();
          Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_180);
          lock(this,0,&local_180);
          Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_180);
          _kjDefer416.maybeFunc.ptr.field_1._29_1_ = 1;
          f_1.exception._0_4_ = 1;
          goto LAB_001f16d5;
        }
      }
      local_164 = iVar4;
      setCurrentThreadIsNoLongerWaiting();
    } while ((int)waiter.exception.ptr.ptr == 0);
    _kjDefer416.maybeFunc.ptr.field_1._29_1_ = 1;
    assertLockedByCaller(this,EXCLUSIVE);
    this_00 = readMaybe<kj::Exception,decltype(nullptr)>
                        ((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)&waiter.predicate);
    if (this_00 != (Own<kj::Exception,_std::nullptr_t> *)0x0) {
      t_00 = Own<kj::Exception,_std::nullptr_t>::operator*(this_00);
      exception_00 = mv<kj::Exception>(t_00);
      throwFatalException(exception_00,0);
    }
    f_1.exception._0_4_ = 1;
  }
  else {
    f_1.exception._0_4_ = 0;
  }
LAB_001f16d5:
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:410:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
               *)local_a0);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:405:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:405:3)>
               *)((long)&_kjDefer416.maybeFunc.ptr.field_1 + 0x1f));
  Waiter::~Waiter((Waiter *)local_58);
  return extraout_EAX;
}

Assistant:

void Mutex::wait(Predicate& predicate, Maybe<Duration> timeout, LockSourceLocationArg location) {
  // Add waiter to list.
  Waiter waiter { kj::none, waitersTail, predicate, kj::none, 0, timeout != kj::none };
  addWaiter(waiter);

  BlockedOnReason blockReason = BlockedOnCondVarWait{*this, &waiter, location};
  KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

  // To guarantee that we've re-locked the mutex before scope exit, keep track of whether it is
  // currently.
  bool currentlyLocked = true;
  KJ_DEFER({
    // Infinite timeout for re-obtaining the lock is on purpose because the post-condition for this
    // function has to be that the lock state hasn't changed (& we have to be locked when we enter
    // since that's how condvars work).
    if (!currentlyLocked) lock(EXCLUSIVE, kj::none, location);
    removeWaiter(waiter);
  });

  if (!predicate.check()) {
    unlock(EXCLUSIVE, &waiter);
    currentlyLocked = false;

    struct timespec ts;
    struct timespec* tsp = nullptr;
    KJ_IF_SOME(t, timeout) {
      ts = toAbsoluteTimespec(now() + t);
      tsp = &ts;
    }

    setCurrentThreadIsWaitingFor(&blockReason);

    // Wait for someone to set our futex to 1.
    for (;;) {
      // Note we use FUTEX_WAIT_BITSET_PRIVATE + FUTEX_BITSET_MATCH_ANY to get the same effect as
      // FUTEX_WAIT_PRIVATE except that the timeout is specified as an absolute time based on
      // CLOCK_MONOTONIC. Otherwise, FUTEX_WAIT_PRIVATE interprets it as a relative time, forcing
      // us to recompute the time after every iteration.
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_futex,
          &waiter.futex, FUTEX_WAIT_BITSET_PRIVATE, 0, tsp, nullptr, FUTEX_BITSET_MATCH_ANY)) {
        case EAGAIN:
          // Indicates that the futex was already non-zero by the time the kernel looked at it.
          // Not an error.
          break;
        case ETIMEDOUT: {
          // Wait timed out. This leaves us in a bit of a pickle: Ownership of the mutex was not
          // transferred to us from another thread. So, we need to lock it ourselves. But, another
          // thread might be in the process of signaling us and transferring ownership. So, we
          // first must atomically take control of our destiny.
          KJ_ASSERT(timeout != kj::none);
          uint expected = 0;
          if (__atomic_compare_exchange_n(&waiter.futex, &expected, 1, false,
                                          __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
            // OK, we set our own futex to 1. That means no other thread will, and so we won't be
            // receiving a mutex ownership transfer. We have to lock the mutex ourselves.
            setCurrentThreadIsNoLongerWaiting();
            lock(EXCLUSIVE, kj::none, location);
            currentlyLocked = true;
            return;
          } else {
            // Oh, someone else actually did signal us, apparently. Let's move on as if the futex
            // call told us so.
            break;
          }
        }
        default:
          KJ_FAIL_SYSCALL("futex(FUTEX_WAIT_PRIVATE)", error);
      }

      setCurrentThreadIsNoLongerWaiting();

      if (__atomic_load_n(&waiter.futex, __ATOMIC_ACQUIRE)) {
        // We received a lock ownership transfer from another thread.
        currentlyLocked = true;

        // The other thread checked the predicate before the transfer.
#ifdef KJ_DEBUG
        assertLockedByCaller(EXCLUSIVE);
#endif

        KJ_IF_SOME(exception, waiter.exception) {
          // The predicate threw an exception, apparently. Propagate it.
          // TODO(someday): Could we somehow have this be a recoverable exception? Presumably we'd
          //   then want MutexGuarded::when() to skip calling the callback, but then what should it
          //   return, since it normally returns the callback's result? Or maybe people who disable
          //   exceptions just really should not write predicates that can throw.
          kj::throwFatalException(kj::mv(*exception));
        }

        return;
      }
    }
  }
}